

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

void __thiscall asl::XdlEncoder::new_number(XdlEncoder *this,int x)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  
  iVar1 = (this->_out)._len;
  String::resize(&this->_out,iVar1 + 0xb,true,true);
  if ((this->_out)._size == 0) {
    paVar3 = &(this->_out).field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_out).field_2._str;
  }
  iVar2 = myitoa(x,paVar3->_space + iVar1);
  (this->_out)._len = iVar2 + iVar1;
  return;
}

Assistant:

void XdlEncoder::new_number(int x)
{
	int n = _out.length();
	_out.resize(n+11);
	_out.fix(n + myitoa(x, &_out[n]));
}